

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O2

void cmFortranParser_RuleInclude(cmFortranParser *parser,char *name)

{
  bool bVar1;
  _Elt_pointer pcVar2;
  string fullName;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char *local_38 [4];
  
  if (parser->InPPFalseBranch == 0) {
    pcVar2 = (parser->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pcVar2 == (parser->FileStack).c.
                  super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) {
      __assert_fail("!parser->FileStack.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFortranParserImpl.cxx"
                    ,0xe3,"void cmFortranParser_RuleInclude(cmFortranParser *, const char *)");
    }
    if (pcVar2 == (parser->FileStack).c.
                  super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pcVar2 = (parser->FileStack).c.
               super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 9;
    }
    std::__cxx11::string::string((string *)local_38,(string *)&pcVar2[-1].Directory);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    bVar1 = cmFortranParser_s::FindIncludeFile(parser,local_38[0],name,&local_58);
    if (bVar1) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&parser->Info->Includes,&local_58);
      cmFortranParser_FilePush(parser,local_58._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void cmFortranParser_RuleInclude(cmFortranParser* parser, const char* name)
{
  if (parser->InPPFalseBranch) {
    return;
  }

  // If processing an include statement there must be an open file.
  assert(!parser->FileStack.empty());

  // Get the directory containing the source in which the include
  // statement appears.  This is always the first search location for
  // Fortran include files.
  std::string dir = parser->FileStack.top().Directory;

  // Find the included file.  If it cannot be found just ignore the
  // problem because either the source will not compile or the user
  // does not care about depending on this included source.
  std::string fullName;
  if (parser->FindIncludeFile(dir.c_str(), name, fullName)) {
    // Found the included file.  Save it in the set of included files.
    parser->Info.Includes.insert(fullName);

    // Parse it immediately to translate the source inline.
    cmFortranParser_FilePush(parser, fullName.c_str());
  }
}